

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O3

bool Potassco::parseUnsigned(char **x,unsigned_long_long *out,unsigned_long_long uMax)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char *in_RAX;
  ulong uVar4;
  int *piVar5;
  long lVar6;
  char *err;
  char *local_38;
  
  pcVar2 = *x;
  if (pcVar2 == (char *)0x0) {
    return false;
  }
  cVar1 = *pcVar2;
  if (cVar1 == '\0') {
    return false;
  }
  if ((cVar1 == '-') && (pcVar2[1] != '1')) {
    return false;
  }
  lVar6 = 4;
  local_38 = in_RAX;
  iVar3 = strncmp(pcVar2,"imax",4);
  if (iVar3 == 0) {
LAB_0011a800:
    *out = uMax >> (cVar1 == 'i');
    *x = pcVar2 + lVar6;
    return true;
  }
  lVar6 = 4;
  iVar3 = strncmp(pcVar2,"umax",4);
  if (iVar3 == 0) goto LAB_0011a800;
  if (cVar1 == '-') {
    lVar6 = 2;
    if (pcVar2[1] == '1') goto LAB_0011a800;
LAB_0011a841:
    iVar3 = 10;
  }
  else {
    if (cVar1 != '0') goto LAB_0011a841;
    iVar3 = 0x10;
    if (((byte)(pcVar2[1] | 0x20U) != 0x78) && (iVar3 = 8, (pcVar2[1] & 0xf8U) != 0x30))
    goto LAB_0011a841;
  }
  uVar4 = strtoull(pcVar2,&local_38,iVar3);
  *out = uVar4;
  if (uVar4 != 0xffffffffffffffff) goto LAB_0011a8b9;
  piVar5 = __errno_location();
  uVar4 = 0xffffffffffffffff;
  if (*piVar5 != 0x22) goto LAB_0011a8b9;
  *piVar5 = 0;
  pcVar2 = *x;
  if (*pcVar2 == '0') {
    iVar3 = 0x10;
    if (((byte)(pcVar2[1] | 0x20U) != 0x78) && (iVar3 = 8, (pcVar2[1] & 0xf8U) != 0x30))
    goto LAB_0011a89e;
  }
  else {
LAB_0011a89e:
    iVar3 = 10;
  }
  uVar4 = strtoull(pcVar2,(char **)0x0,iVar3);
  if (*piVar5 == 0x22) {
    return false;
  }
  if (*out != uVar4) {
    return false;
  }
LAB_0011a8b9:
  if (uVar4 <= uMax && local_38 != *x) {
    *x = local_38;
    return true;
  }
  return false;
}

Assistant:

static bool parseUnsigned(const char*& x, unsigned long long& out, unsigned long long uMax) {
	if (!x || !*x || (*x == '-' && x[1] != '1')) {
		return false;
	}
	std::size_t len = 4;
	if (std::strncmp(x, "imax", len) == 0 || std::strncmp(x, "umax", len) == 0 || std::strncmp(x, "-1", len=2) == 0) {
		out = *x != 'i' ? uMax : uMax >> 1;
		x  += len;
		return true;
	}
	char* err;
	out = strtoull(x, &err, detectBase(x));
	if (out == ULLONG_MAX && errno == ERANGE) {
		errno = 0;
		unsigned long long temp = strtoull(x, 0, detectBase(x));
		if (errno == ERANGE || out != temp) {
			return false;
		}
	}
	if (err == x || out > uMax) {
		return false;
	}
	x = err;
	return true;
}